

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void ResetButtonStates(void)

{
  FButtonStatus *pFVar1;
  long lVar2;
  
  lVar2 = 0x2e8;
  do {
    pFVar1 = *(FButtonStatus **)(ActionMaps[0].Name + lVar2 + -0xc);
    if (pFVar1 != &Button_Klook && pFVar1 != &Button_Mlook) {
      pFVar1->Keys[4] = 0;
      pFVar1->Keys[5] = 0;
      pFVar1->Keys[0] = 0;
      pFVar1->Keys[1] = 0;
      pFVar1->Keys[2] = 0;
      pFVar1->Keys[3] = 0;
      pFVar1->bDown = '\0';
    }
    pFVar1->bWentDown = '\0';
    pFVar1->bWentUp = '\0';
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return;
}

Assistant:

void ResetButtonStates ()
{
	for (int i = NUM_ACTIONS-1; i >= 0; --i)
	{
		FButtonStatus *button = ActionMaps[i].Button;

		if (button != &Button_Mlook && button != &Button_Klook)
		{
			button->ReleaseKey (0);
		}
		button->ResetTriggers ();
	}
}